

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O2

int __thiscall
tcu::Float<unsigned_int,_5,_5,_15,_2U>::exponent(Float<unsigned_int,_5,_5,_15,_2U> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  uVar1 = this->m_value;
  iVar3 = (uVar1 >> 5 & 0x1f) - 0xf;
  iVar2 = -0xe;
  if ((uVar1 & 0x1f) == 0) {
    iVar2 = iVar3;
  }
  if ((uVar1 & 0x3e0) != 0) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

inline StorageType		exponentBits	(void) const	{ return (m_value >> MantissaBits) & ((StorageType(1)<<ExponentBits)-1);	}